

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  Value *pVVar1;
  Value *pVVar2;
  Value *key;
  Value *this;
  Value *in_stack_fffffffffffffe38;
  Value *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  Value *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 uVar3;
  Value *in_stack_fffffffffffffe60;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  Value::Value(in_stack_fffffffffffffe60,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(in_stack_fffffffffffffe60,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(in_stack_fffffffffffffe60,(bool)uVar3);
  Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(in_stack_fffffffffffffe60,(bool)uVar3);
  pVVar1 = Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(pVVar1,(bool)uVar3);
  pVVar2 = Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(pVVar1,(Int)((ulong)pVVar2 >> 0x20));
  uVar3 = (undefined1)((ulong)pVVar2 >> 0x38);
  pVVar2 = Value::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(pVVar1,(bool)uVar3);
  key = Value::operator[](pVVar2,in_stack_fffffffffffffe48);
  Value::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Value::~Value(in_stack_fffffffffffffe40);
  Value::Value(pVVar1,(bool)uVar3);
  this = Value::operator[](pVVar2,(char *)key);
  Value::operator=(this,in_stack_fffffffffffffe38);
  Value::~Value(this);
  Value::Value(pVVar1,(bool)uVar3);
  pVVar1 = Value::operator[](pVVar2,(char *)key);
  Value::operator=(this,pVVar1);
  Value::~Value(this);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings) {
  //! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
  //! [CharReaderBuilderStrictMode]
}